

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localenc.c
# Opt level: O3

int charset_from_localenc(char *name)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  __int32_t **pp_Var4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  
  iVar3 = charset_from_mimeenc(name);
  if ((iVar3 == 0) && (iVar3 = charset_from_xenc(name), iVar3 == 0)) {
    bVar1 = *name;
    lVar8 = 0;
    do {
      pbVar2 = (byte *)localencs[lVar8].name;
      bVar6 = *pbVar2;
      if (bVar1 == 0 && bVar6 == 0) {
LAB_0011578e:
        return localencs[lVar8].charset;
      }
      pp_Var4 = __ctype_tolower_loc();
      lVar5 = 1;
      bVar7 = bVar1;
      while ((*pp_Var4)[bVar7] == (*pp_Var4)[bVar6]) {
        bVar7 = name[lVar5];
        bVar6 = pbVar2[lVar5];
        lVar5 = lVar5 + 1;
        if (bVar6 == 0 && bVar7 == 0) goto LAB_0011578e;
      }
      if (!(bool)(~(bVar7 == 0) & 1) && bVar6 == 0) goto LAB_0011578e;
      lVar8 = lVar8 + 1;
      iVar3 = 0;
    } while (lVar8 != 0x38);
  }
  return iVar3;
}

Assistant:

int charset_from_localenc(const char *name)
{
    int i;

    if ( (i = charset_from_mimeenc(name)) != CS_NONE)
        return i;
    if ( (i = charset_from_xenc(name)) != CS_NONE)
        return i;

    for (i = 0; i < (int)lenof(localencs); i++) {
        const char *p, *q;
        p = name;
        q = localencs[i].name;
        while (*p || *q) {
                if (tolower((unsigned char)*p) != tolower((unsigned char)*q))
                break;
            p++; q++;
        }
        if (!*p && !*q)
            return localencs[i].charset;
    }

    return CS_NONE;                    /* not found */
}